

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isac.c
# Opt level: O2

int16_t WebRtcIsac_SetDecSampRate(ISACStruct *ISAC_main_inst,uint16_t sample_rate_hz)

{
  undefined4 uVar1;
  undefined2 in_register_00000032;
  
  if (CONCAT22(in_register_00000032,sample_rate_hz) == 32000) {
    uVar1 = 0x20;
    if (*(int *)(ISAC_main_inst + 0x538dc) == 0x10) {
      *(undefined8 *)(ISAC_main_inst + 0x538c0) = 0;
      *(undefined8 *)(ISAC_main_inst + 0x538c8) = 0;
      *(undefined8 *)(ISAC_main_inst + 0x538b0) = 0;
      *(undefined8 *)(ISAC_main_inst + 0x538b8) = 0;
      *(undefined8 *)(ISAC_main_inst + 0x538a0) = 0;
      *(undefined8 *)(ISAC_main_inst + 0x538a8) = 0;
      DecoderInitUb((ISACUBStruct *)(ISAC_main_inst + 0x2b3d0));
    }
  }
  else {
    if (CONCAT22(in_register_00000032,sample_rate_hz) != 16000) {
      *(undefined2 *)(ISAC_main_inst + 0x538d0) = 0x17a2;
      return -1;
    }
    uVar1 = 0x10;
  }
  *(undefined4 *)(ISAC_main_inst + 0x538dc) = uVar1;
  return 0;
}

Assistant:

int16_t WebRtcIsac_SetDecSampRate(ISACStruct* ISAC_main_inst,
                                  uint16_t sample_rate_hz) {
  ISACMainStruct* instISAC = (ISACMainStruct*)ISAC_main_inst;
  enum IsacSamplingRate decoder_operational_rate;

  if (sample_rate_hz == 16000) {
    decoder_operational_rate = kIsacWideband;
  } else if (sample_rate_hz == 32000) {
    decoder_operational_rate = kIsacSuperWideband;
  } else {
    /* Sampling Frequency is not supported. */
    instISAC->errorCode = ISAC_UNSUPPORTED_SAMPLING_FREQUENCY;
    return -1;
  }

  if ((instISAC->decoderSamplingRateKHz == kIsacWideband) &&
        (decoder_operational_rate == kIsacSuperWideband)) {
      /* Switching from wideband to super-wideband at the decoder
       * we need to reset the filter-bank and initialize upper-band decoder. */
      memset(instISAC->synthesisFBState1, 0,
             FB_STATE_SIZE_WORD32 * sizeof(int32_t));
      memset(instISAC->synthesisFBState2, 0,
             FB_STATE_SIZE_WORD32 * sizeof(int32_t));

      DecoderInitUb(&instISAC->instUB);
  }
  instISAC->decoderSamplingRateKHz = decoder_operational_rate;
  return 0;
}